

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpControl.h
# Opt level: O3

int ConnectgpControl(GPCONTROL *pgpControl,char *szCfgFilePath)

{
  SOCKET *pSock;
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  size_t sVar3;
  SOCKET sock;
  int BytesReceived;
  char *body;
  char *title;
  char line [256];
  char streamingstatustmp [256];
  int local_294;
  char *local_290;
  char *local_288;
  BOOL *local_280;
  BOOL *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  int *local_250;
  char *local_248;
  int *local_240;
  byte local_238;
  char local_237;
  timespec local_138 [16];
  
  local_288 = (char *)0x0;
  local_290 = (char *)0x0;
  local_294 = 0;
  memset(pgpControl->szCfgFilePath,0,0x100);
  sprintf(pgpControl->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar1 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar1 != 0) {
    memset(&local_238,0,0x100);
    memset(pgpControl->szDevPath + 0x14,0,0xec);
    builtin_strncpy(pgpControl->szDevPath,"udp://10.5.5.9:8554",0x14);
    pgpControl->threadperiod = 100;
    memset(&pgpControl->bSaveRawData,0,0x110);
    memcpy(pgpControl->streamingstarthttpreq,
           "http://10.5.5.9/gp/gpControl/execute?p1=gpStream&a1=proto_v2&c1=restart",0x48);
    memset(pgpControl->streamingbitratehttpreq + 0x30,0,0xd0);
    builtin_strncpy(pgpControl->streamingbitratehttpreq,
                    "http://10.5.5.9/gp/gpControl/setting/62/2000000",0x30);
    memset(pgpControl->streamingresolutionhttpreq + 0x2a,0,0xd6);
    builtin_strncpy(pgpControl->streamingresolutionhttpreq,
                    "http://10.5.5.9/gp/gpControl/setting/64/7",0x2a);
    memset(pgpControl->statushttpreq + 0x24,0,0xdc);
    builtin_strncpy(pgpControl->statushttpreq,"http://10.5.5.9/gp/gpControl/status",0x24);
    pgpControl->streamingstatusid = 0x20;
    memset(pgpControl->keepalivemsg + 0x16,0,0xea);
    builtin_strncpy(pgpControl->keepalivemsg,"_GPHD_:0:0:2:0.000000",0x16);
    pgpControl->keepaliveperiod = 2000;
    __stream = fopen(szCfgFilePath,"r");
    if (__stream == (FILE *)0x0) {
      pcVar2 = "Configuration file not found.";
    }
    else {
      local_280 = &pgpControl->bDisableStreamingSettings;
      local_278 = &pgpControl->bDisableStatusCheck;
      local_270 = pgpControl->streamingbitratehttpreq;
      local_260 = pgpControl->streamingresolutionhttpreq;
      local_258 = pgpControl->statushttpreq;
      local_250 = &pgpControl->streamingstatusid;
      local_248 = pgpControl->keepalivemsg;
      local_240 = &pgpControl->keepaliveperiod;
      local_268 = pgpControl->streamingstarthttpreq;
      while( true ) {
        while (pcVar2 = fgets((char *)&local_238,0x100,__stream), 0x24 < local_238) {
          if (local_238 == 0x25) goto LAB_00166125;
          if (((local_238 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_237 != '/'))
          goto LAB_0016613d;
        }
        if (local_238 != 0x23) break;
LAB_00166125:
        if (pcVar2 == (char *)0x0) goto LAB_00166142;
      }
      if (local_238 == 0x24) goto LAB_00166142;
LAB_0016613d:
      if (pcVar2 == (char *)0x0) {
LAB_00166142:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_238,"%255s",pgpControl->szDevPath);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_238,0x100,__stream), 0x24 < local_238) {
          if (local_238 == 0x25) goto LAB_001661b1;
          if (((local_238 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_237 != '/'))
          goto LAB_001661bd;
        }
        if (local_238 != 0x23) break;
LAB_001661b1:
        if (pcVar2 == (char *)0x0) goto LAB_001661c2;
      }
      if (local_238 == 0x24) goto LAB_001661c2;
LAB_001661bd:
      if (pcVar2 == (char *)0x0) {
LAB_001661c2:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_238,"%d",&pgpControl->threadperiod);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_238,0x100,__stream), 0x24 < local_238) {
          if (local_238 == 0x25) goto LAB_00166231;
          if (((local_238 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_237 != '/'))
          goto LAB_0016623d;
        }
        if (local_238 != 0x23) break;
LAB_00166231:
        if (pcVar2 == (char *)0x0) goto LAB_00166242;
      }
      if (local_238 == 0x24) goto LAB_00166242;
LAB_0016623d:
      if (pcVar2 == (char *)0x0) {
LAB_00166242:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_238,"%d",&pgpControl->bDisableHTTPPersistent);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_238,0x100,__stream), 0x24 < local_238) {
          if (local_238 == 0x25) goto LAB_001662b1;
          if (((local_238 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_237 != '/'))
          goto LAB_001662bd;
        }
        if (local_238 != 0x23) break;
LAB_001662b1:
        if (pcVar2 == (char *)0x0) goto LAB_001662c2;
      }
      if (local_238 == 0x24) goto LAB_001662c2;
LAB_001662bd:
      if (pcVar2 == (char *)0x0) {
LAB_001662c2:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_238,"%d",local_280);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_238,0x100,__stream), 0x24 < local_238) {
          if (local_238 == 0x25) goto LAB_00166333;
          if (((local_238 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_237 != '/'))
          goto LAB_0016633f;
        }
        if (local_238 != 0x23) break;
LAB_00166333:
        if (pcVar2 == (char *)0x0) goto LAB_00166344;
      }
      if (local_238 == 0x24) goto LAB_00166344;
LAB_0016633f:
      if (pcVar2 == (char *)0x0) {
LAB_00166344:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_238,"%d",local_278);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_238,0x100,__stream), 0x24 < local_238) {
          if (local_238 == 0x25) goto LAB_001663b5;
          if (((local_238 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_237 != '/'))
          goto LAB_001663c1;
        }
        if (local_238 != 0x23) break;
LAB_001663b5:
        if (pcVar2 == (char *)0x0) goto LAB_001663c6;
      }
      if (local_238 == 0x24) goto LAB_001663c6;
LAB_001663c1:
      if (pcVar2 == (char *)0x0) {
LAB_001663c6:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_238,"%255s",local_268);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_238,0x100,__stream), 0x24 < local_238) {
          if (local_238 == 0x25) goto LAB_00166437;
          if (((local_238 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_237 != '/'))
          goto LAB_00166443;
        }
        if (local_238 != 0x23) break;
LAB_00166437:
        if (pcVar2 == (char *)0x0) goto LAB_00166448;
      }
      if (local_238 == 0x24) goto LAB_00166448;
LAB_00166443:
      if (pcVar2 == (char *)0x0) {
LAB_00166448:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_238,"%255s",local_270);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_238,0x100,__stream), 0x24 < local_238) {
          if (local_238 == 0x25) goto LAB_001664b9;
          if (((local_238 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_237 != '/'))
          goto LAB_001664c5;
        }
        if (local_238 != 0x23) break;
LAB_001664b9:
        if (pcVar2 == (char *)0x0) goto LAB_001664ca;
      }
      if (local_238 == 0x24) goto LAB_001664ca;
LAB_001664c5:
      if (pcVar2 == (char *)0x0) {
LAB_001664ca:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_238,"%255s",local_260);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_238,0x100,__stream), 0x24 < local_238) {
          if (local_238 == 0x25) goto LAB_0016653b;
          if (((local_238 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_237 != '/'))
          goto LAB_00166547;
        }
        if (local_238 != 0x23) break;
LAB_0016653b:
        if (pcVar2 == (char *)0x0) goto LAB_0016654c;
      }
      if (local_238 == 0x24) goto LAB_0016654c;
LAB_00166547:
      if (pcVar2 == (char *)0x0) {
LAB_0016654c:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_238,"%255s",local_258);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_238,0x100,__stream), 0x24 < local_238) {
          if (local_238 == 0x25) goto LAB_001665bd;
          if (((local_238 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_237 != '/'))
          goto LAB_001665c9;
        }
        if (local_238 != 0x23) break;
LAB_001665bd:
        if (pcVar2 == (char *)0x0) goto LAB_001665ce;
      }
      if (local_238 == 0x24) goto LAB_001665ce;
LAB_001665c9:
      if (pcVar2 == (char *)0x0) {
LAB_001665ce:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_238,"%d",local_250);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_238,0x100,__stream), 0x24 < local_238) {
          if (local_238 == 0x25) goto LAB_0016663f;
          if (((local_238 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_237 != '/'))
          goto LAB_0016664b;
        }
        if (local_238 != 0x23) break;
LAB_0016663f:
        if (pcVar2 == (char *)0x0) goto LAB_00166650;
      }
      if (local_238 == 0x24) goto LAB_00166650;
LAB_0016664b:
      if (pcVar2 == (char *)0x0) {
LAB_00166650:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_238,"%255s",local_248);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_238,0x100,__stream), 0x24 < local_238) {
          if (local_238 == 0x25) goto LAB_001666c1;
          if (((local_238 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_237 != '/'))
          goto LAB_001666cd;
        }
        if (local_238 != 0x23) break;
LAB_001666c1:
        if (pcVar2 == (char *)0x0) goto LAB_001666d2;
      }
      if (local_238 == 0x24) goto LAB_001666d2;
LAB_001666cd:
      if (pcVar2 == (char *)0x0) {
LAB_001666d2:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_238,"%d",local_240);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      iVar1 = fclose(__stream);
      if (iVar1 == 0) goto LAB_0016671f;
      pcVar2 = "fclose() failed.";
    }
    puts(pcVar2);
  }
LAB_0016671f:
  if (pgpControl->threadperiod < 0) {
    puts("Invalid parameter : threadperiod.");
    pgpControl->threadperiod = 100;
  }
  iVar1 = OpenRS232Port(&pgpControl->RS232Port,pgpControl->szDevPath);
  if (iVar1 != 0) {
    puts("Unable to connect to a gpControl.");
    return 1;
  }
  pSock = &pgpControl->tcpsock;
  pcVar2 = (pgpControl->RS232Port).address;
  iVar1 = inittcpcli(pSock,pcVar2,"80");
  if (iVar1 != 0) goto LAB_00166783;
  iVar1 = sendsimplehttpgetreq(pgpControl->tcpsock,pgpControl->streamingstarthttpreq);
  if (iVar1 != 0) {
    puts("Unable to connect to a gpControl.");
    iVar1 = pgpControl->tcpsock;
    shutdown(iVar1,2);
    close(iVar1);
    goto LAB_001667cc;
  }
  if ((pgpControl->bDisableStatusCheck == 0) &&
     (iVar1 = recvsimplehtml(*pSock,&local_288,&local_290,0x100,&local_294), iVar1 != 0))
  goto LAB_00166a5e;
  if (pgpControl->bDisableHTTPPersistent != 0) {
    iVar1 = *pSock;
    shutdown(iVar1,2);
    iVar1 = close(iVar1);
    if (iVar1 != 0) goto LAB_00166783;
  }
  if (pgpControl->bDisableStreamingSettings == 0) {
    if ((pgpControl->bDisableHTTPPersistent == 0) ||
       (iVar1 = inittcpcli(pSock,pcVar2,"80"), iVar1 == 0)) {
      iVar1 = sendsimplehttpgetreq(pgpControl->tcpsock,pgpControl->streamingbitratehttpreq);
      if ((iVar1 != 0) ||
         ((pgpControl->bDisableStatusCheck == 0 &&
          (iVar1 = recvsimplehtml(*pSock,&local_288,&local_290,0x100,&local_294), iVar1 != 0)))) {
LAB_00166a5e:
        puts("Unable to connect to a gpControl.");
        sock = pgpControl->tcpsock;
LAB_00166a70:
        releasetcpcli(sock);
        goto LAB_001667cc;
      }
      if ((pgpControl->bDisableHTTPPersistent == 0) ||
         ((iVar1 = releasetcpcli(*pSock), iVar1 == 0 &&
          ((pgpControl->bDisableHTTPPersistent == 0 ||
           (iVar1 = inittcpcli(pSock,pcVar2,"80"), iVar1 == 0)))))) {
        iVar1 = sendsimplehttpgetreq(pgpControl->tcpsock,pgpControl->streamingresolutionhttpreq);
        if ((iVar1 != 0) ||
           ((pgpControl->bDisableStatusCheck == 0 &&
            (iVar1 = recvsimplehtml(*pSock,&local_288,&local_290,0x100,&local_294), iVar1 != 0))))
        goto LAB_00166a5e;
        if ((pgpControl->bDisableHTTPPersistent == 0) || (iVar1 = releasetcpcli(*pSock), iVar1 == 0)
           ) goto LAB_00166828;
      }
    }
  }
  else {
LAB_00166828:
    local_138[0].tv_sec = 0;
    local_138[0].tv_nsec = 250000000;
    nanosleep(local_138,(timespec *)0x0);
    if (pgpControl->bDisableStatusCheck != 0) {
LAB_00166856:
      puts("gpControl connected.");
      return 0;
    }
    if ((pgpControl->bDisableHTTPPersistent == 0) ||
       (iVar1 = inittcpcli(pSock,pcVar2,"80"), iVar1 == 0)) {
      iVar1 = sendsimplehttpgetreq(pgpControl->tcpsock,pgpControl->statushttpreq);
      if ((iVar1 != 0) ||
         (iVar1 = recvsimplehtml(*pSock,&local_288,&local_290,0x100,&local_294), iVar1 != 0))
      goto LAB_00166a5e;
      if ((pgpControl->bDisableHTTPPersistent == 0) || (iVar1 = releasetcpcli(*pSock), iVar1 == 0))
      {
        sprintf((char *)local_138,"\"%d\":",(ulong)(uint)pgpControl->streamingstatusid);
        pcVar2 = strstr(local_290,(char *)local_138);
        if ((pcVar2 != (char *)0x0) && (sVar3 = strlen((char *)local_138), pcVar2[sVar3] == '1')) {
          free(local_288);
          free(local_290);
          goto LAB_00166856;
        }
        puts("Unable to connect to a gpControl.");
        free(local_288);
        free(local_290);
        if (pgpControl->bDisableHTTPPersistent != 0) goto LAB_001667cc;
        sock = *pSock;
        goto LAB_00166a70;
      }
    }
  }
LAB_00166783:
  puts("Unable to connect to a gpControl.");
LAB_001667cc:
  CloseRS232Port(&pgpControl->RS232Port);
  return 1;
}

Assistant:

inline int ConnectgpControl(GPCONTROL* pgpControl, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];
	char* ptr = NULL;
	char* title = NULL;
	char* body = NULL;
	int BytesReceived = 0;
	char streamingstatustmp[256];

	memset(pgpControl->szCfgFilePath, 0, sizeof(pgpControl->szCfgFilePath));
	sprintf(pgpControl->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pgpControl->szDevPath, 0, sizeof(pgpControl->szDevPath));
		sprintf(pgpControl->szDevPath, "udp://10.5.5.9:8554");
		//pgpControl->BaudRate = 9600;
		//pgpControl->timeout = 1000;
		pgpControl->threadperiod = 100;
		pgpControl->bSaveRawData = 0; // Not a parameter at the moment...
		pgpControl->bDisableHTTPPersistent = 0;
		pgpControl->bDisableStreamingSettings = 0;
		pgpControl->bDisableStatusCheck = 0;
		memset(pgpControl->streamingstarthttpreq, 0, sizeof(pgpControl->streamingstarthttpreq));
		sprintf(pgpControl->streamingstarthttpreq, "http://10.5.5.9/gp/gpControl/execute?p1=gpStream&a1=proto_v2&c1=restart");
		memset(pgpControl->streamingbitratehttpreq, 0, sizeof(pgpControl->streamingbitratehttpreq));
		sprintf(pgpControl->streamingbitratehttpreq, "http://10.5.5.9/gp/gpControl/setting/62/2000000");
		memset(pgpControl->streamingresolutionhttpreq, 0, sizeof(pgpControl->streamingresolutionhttpreq));
		sprintf(pgpControl->streamingresolutionhttpreq, "http://10.5.5.9/gp/gpControl/setting/64/7");
		memset(pgpControl->statushttpreq, 0, sizeof(pgpControl->statushttpreq));
		sprintf(pgpControl->statushttpreq, "http://10.5.5.9/gp/gpControl/status");
		pgpControl->streamingstatusid = 32;
		memset(pgpControl->keepalivemsg, 0, sizeof(pgpControl->keepalivemsg));
		sprintf(pgpControl->keepalivemsg, "_GPHD_:0:0:2:0.000000");
		pgpControl->keepaliveperiod = 2000;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pgpControl->szDevPath) != 1) printf("Invalid configuration file.\n");
			//if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			//if (sscanf(line, "%d", &pgpControl->BaudRate) != 1) printf("Invalid configuration file.\n");
			//if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			//if (sscanf(line, "%d", &pgpControl->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pgpControl->threadperiod) != 1) printf("Invalid configuration file.\n");
			//if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			//if (sscanf(line, "%d", &pgpControl->bSaveRawData) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pgpControl->bDisableHTTPPersistent) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pgpControl->bDisableStreamingSettings) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pgpControl->bDisableStatusCheck) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pgpControl->streamingstarthttpreq) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pgpControl->streamingbitratehttpreq) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pgpControl->streamingresolutionhttpreq) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pgpControl->statushttpreq) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pgpControl->streamingstatusid) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pgpControl->keepalivemsg) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pgpControl->keepaliveperiod) != 1) printf("Invalid configuration file.\n");
			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}

	if (pgpControl->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pgpControl->threadperiod = 100;
	}

	// Used to save raw data, should be handled specifically...
	//pgpControl->pfSaveFile = NULL;

	//pgpControl->LastVal = 0;

	// UDP connection.
	if (OpenRS232Port(&pgpControl->RS232Port, pgpControl->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a gpControl.\n");
		return EXIT_FAILURE;
	}

	//if (SetOptionsRS232Port(&pgpControl->RS232Port, pgpControl->BaudRate, NOPARITY, FALSE, 8, 
	//	ONESTOPBIT, (UINT)pgpControl->timeout) != EXIT_SUCCESS)
	//{
	//	printf("Unable to connect to a gpControl.\n");
	//	CloseRS232Port(&pgpControl->RS232Port);
	//	return EXIT_FAILURE;
	//}

	// Web connection.
	if (inittcpcli(&pgpControl->tcpsock, pgpControl->RS232Port.address, "80") != EXIT_SUCCESS)
	{
		printf("Unable to connect to a gpControl.\n");
		CloseRS232Port(&pgpControl->RS232Port);
		return EXIT_FAILURE;
	}

	if (sendsimplehttpgetreq(pgpControl->tcpsock, pgpControl->streamingstarthttpreq) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a gpControl.\n");
		releasetcpcli(pgpControl->tcpsock);
		CloseRS232Port(&pgpControl->RS232Port);
		return EXIT_FAILURE;
	}
	if (!pgpControl->bDisableStatusCheck)
	{
		if (recvsimplehtml(pgpControl->tcpsock, &title, &body, MAX_NB_BYTES_GPCONTROL, &BytesReceived) != EXIT_SUCCESS)
		{
			printf("Unable to connect to a gpControl.\n");
			releasetcpcli(pgpControl->tcpsock);
			CloseRS232Port(&pgpControl->RS232Port);
			return EXIT_FAILURE;
		}
	}
	if (pgpControl->bDisableHTTPPersistent)
	{
		if (releasetcpcli(pgpControl->tcpsock) != EXIT_SUCCESS)
		{
			printf("Unable to connect to a gpControl.\n");
			CloseRS232Port(&pgpControl->RS232Port);
			return EXIT_FAILURE;
		}
	}

	if (!pgpControl->bDisableStreamingSettings)
	{
		if (pgpControl->bDisableHTTPPersistent)
		{
			if (inittcpcli(&pgpControl->tcpsock, pgpControl->RS232Port.address, "80") != EXIT_SUCCESS)
			{
				printf("Unable to connect to a gpControl.\n");
				CloseRS232Port(&pgpControl->RS232Port);
				return EXIT_FAILURE;
			}
		}
		if (sendsimplehttpgetreq(pgpControl->tcpsock, pgpControl->streamingbitratehttpreq) != EXIT_SUCCESS)
		{
			printf("Unable to connect to a gpControl.\n");
			releasetcpcli(pgpControl->tcpsock);
			CloseRS232Port(&pgpControl->RS232Port);
			return EXIT_FAILURE;
		}
		if (!pgpControl->bDisableStatusCheck)
		{
			if (recvsimplehtml(pgpControl->tcpsock, &title, &body, MAX_NB_BYTES_GPCONTROL, &BytesReceived) != EXIT_SUCCESS)
			{
				printf("Unable to connect to a gpControl.\n");
				releasetcpcli(pgpControl->tcpsock);
				CloseRS232Port(&pgpControl->RS232Port);
				return EXIT_FAILURE;
			}
		}
		if (pgpControl->bDisableHTTPPersistent)
		{
			if (releasetcpcli(pgpControl->tcpsock) != EXIT_SUCCESS)
			{
				printf("Unable to connect to a gpControl.\n");
				CloseRS232Port(&pgpControl->RS232Port);
				return EXIT_FAILURE;
			}
		}
		if (pgpControl->bDisableHTTPPersistent)
		{
			if (inittcpcli(&pgpControl->tcpsock, pgpControl->RS232Port.address, "80") != EXIT_SUCCESS)
			{
				printf("Unable to connect to a gpControl.\n");
				CloseRS232Port(&pgpControl->RS232Port);
				return EXIT_FAILURE;
			}
		}
		if (sendsimplehttpgetreq(pgpControl->tcpsock, pgpControl->streamingresolutionhttpreq) != EXIT_SUCCESS)
		{
			printf("Unable to connect to a gpControl.\n");
			releasetcpcli(pgpControl->tcpsock);
			CloseRS232Port(&pgpControl->RS232Port);
			return EXIT_FAILURE;
		}
		if (!pgpControl->bDisableStatusCheck)
		{
			if (recvsimplehtml(pgpControl->tcpsock, &title, &body, MAX_NB_BYTES_GPCONTROL, &BytesReceived) != EXIT_SUCCESS)
			{
				printf("Unable to connect to a gpControl.\n");
				releasetcpcli(pgpControl->tcpsock);
				CloseRS232Port(&pgpControl->RS232Port);
				return EXIT_FAILURE;
			}
		}
		if (pgpControl->bDisableHTTPPersistent)
		{
			if (releasetcpcli(pgpControl->tcpsock) != EXIT_SUCCESS)
			{
				printf("Unable to connect to a gpControl.\n");
				CloseRS232Port(&pgpControl->RS232Port);
				return EXIT_FAILURE;
			}
		}
	}

	mSleep(250);

	if (!pgpControl->bDisableStatusCheck)
	{
		if (pgpControl->bDisableHTTPPersistent)
		{
			if (inittcpcli(&pgpControl->tcpsock, pgpControl->RS232Port.address, "80") != EXIT_SUCCESS)
			{
				printf("Unable to connect to a gpControl.\n");
				CloseRS232Port(&pgpControl->RS232Port);
				return EXIT_FAILURE;
			}
		}
		if (sendsimplehttpgetreq(pgpControl->tcpsock, pgpControl->statushttpreq) != EXIT_SUCCESS)
		{
			printf("Unable to connect to a gpControl.\n");
			releasetcpcli(pgpControl->tcpsock);
			CloseRS232Port(&pgpControl->RS232Port);
			return EXIT_FAILURE;
		}
		if (recvsimplehtml(pgpControl->tcpsock, &title, &body, MAX_NB_BYTES_GPCONTROL, &BytesReceived) != EXIT_SUCCESS)
		{
			printf("Unable to connect to a gpControl.\n");
			releasetcpcli(pgpControl->tcpsock);
			CloseRS232Port(&pgpControl->RS232Port);
			return EXIT_FAILURE;
		}
		if (pgpControl->bDisableHTTPPersistent)
		{
			if (releasetcpcli(pgpControl->tcpsock) != EXIT_SUCCESS)
			{
				printf("Unable to connect to a gpControl.\n");
				CloseRS232Port(&pgpControl->RS232Port);
				return EXIT_FAILURE;
			}
		}
		sprintf(streamingstatustmp, "\"%d\":", pgpControl->streamingstatusid);
		ptr = strstr(body, streamingstatustmp);
		if ((ptr == NULL)||(ptr[strlen(streamingstatustmp)] != '1'))
		{
			printf("Unable to connect to a gpControl.\n");
			free(title);
			free(body);
			if (!pgpControl->bDisableHTTPPersistent) releasetcpcli(pgpControl->tcpsock);
			CloseRS232Port(&pgpControl->RS232Port);
			return EXIT_FAILURE;
		}
		free(title);
		free(body);
	}

	printf("gpControl connected.\n");

	return EXIT_SUCCESS;
}